

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O3

ostream * testing::operator<<(ostream *os,Message *sb)

{
  void *pvVar1;
  long lVar2;
  char local_39;
  void *local_38;
  long local_30;
  
  internal::StringStreamToString((internal *)&local_38,(sb->ss_).ptr_);
  pvVar1 = local_38;
  if (local_38 == (void *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"(null)",6);
  }
  else if (local_30 != 0) {
    lVar2 = 0;
    do {
      if (*(char *)((long)pvVar1 + lVar2) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
      }
      else {
        local_39 = *(char *)((long)pvVar1 + lVar2);
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_39,1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != local_30);
  }
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  return os;
}

Assistant:

inline std::ostream& operator <<(std::ostream& os, const Message& sb) {
  return os << sb.GetString();
}